

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O1

idx_t __thiscall
duckdb::StandardColumnData::ScanCount
          (StandardColumnData *this,ColumnScanState *state,Vector *result,idx_t count,
          idx_t result_offset)

{
  idx_t iVar1;
  reference state_00;
  ColumnData *this_00;
  
  if (count == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = ColumnData::ScanVector
                      (&this->super_ColumnData,state,result,count,SCAN_FLAT_VECTOR,result_offset);
  }
  this_00 = (ColumnData *)&state->child_states;
  state_00 = vector<duckdb::ColumnScanState,_true>::operator[]
                       ((vector<duckdb::ColumnScanState,_true> *)this_00,0);
  if (count != 0) {
    ColumnData::ScanVector(this_00,state_00,result,count,SCAN_FLAT_VECTOR,result_offset);
  }
  return iVar1;
}

Assistant:

idx_t StandardColumnData::ScanCount(ColumnScanState &state, Vector &result, idx_t count, idx_t result_offset) {
	auto scan_count = ColumnData::ScanCount(state, result, count, result_offset);
	validity.ScanCount(state.child_states[0], result, count, result_offset);
	return scan_count;
}